

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void __thiscall
spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,uint64_t v0,bool specialized)

{
  undefined8 *puVar1;
  long lVar2;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_003fd288;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)&(this->m).c[0].id[0].id + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)((this->m).c[0].id + 4) + lVar2) = 1;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar2 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe0);
  (this->m).id[0] = 0;
  (this->m).id[1] = 0;
  (this->m).id[2] = 0;
  (this->m).id[3] = 0;
  (this->m).columns = 1;
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)0x0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size =
       0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  (this->m).c[0].r[0].u64 = v0;
  (this->m).c[0].vecsize = 1;
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}